

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineTestRunner.cpp
# Opt level: O3

TestOutput * __thiscall
CommandLineTestRunner::createJUnitOutput(CommandLineTestRunner *this,SimpleString *packageName)

{
  JUnitTestOutput *this_00;
  
  this_00 = (JUnitTestOutput *)
            operator_new(0x28,
                         "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/build_O3/CMake/cpputest/cpputest-src/src/CppUTest/CommandLineTestRunner.cpp"
                         ,0x9a);
  JUnitTestOutput::JUnitTestOutput(this_00);
  JUnitTestOutput::setPackageName(this_00,packageName);
  return &this_00->super_TestOutput;
}

Assistant:

TestOutput* CommandLineTestRunner::createJUnitOutput(const SimpleString& packageName)
{
    JUnitTestOutput* junitOutput = new JUnitTestOutput;
    if (junitOutput != NULLPTR) {
      junitOutput->setPackageName(packageName);
    }
    return junitOutput;
}